

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

int __thiscall
QMap<int,_QPointer<QAbstractItemDelegate>_>::remove
          (QMap<int,_QPointer<QAbstractItemDelegate>_> *this,char *__filename)

{
  _Rb_tree_header *p_Var1;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar2;
  size_t sVar3;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_tools_qmap_h:60:29)>
  __pred;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *t;
  int iVar4;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>,_std::_Rb_tree_iterator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
  pVar5;
  insert_iterator<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  __result;
  size_type result;
  key_compare local_51;
  undefined8 local_50;
  undefined8 *local_48;
  char *pcStack_40;
  key_compare *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    iVar4 = 0;
  }
  else if ((__atomic_base<int>)
           *(__int_type *)
            &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1) {
    pVar5 = std::
            _Rb_tree<int,_std::pair<const_int,_QPointer<QAbstractItemDelegate>_>,_std::_Select1st<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
            ::equal_range(&(pQVar2->m)._M_t,(key_type *)__filename);
    sVar3 = (pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<int,_std::pair<const_int,_QPointer<QAbstractItemDelegate>_>,_std::_Select1st<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
    ::_M_erase_aux(&(pQVar2->m)._M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node)
    ;
    iVar4 = (int)sVar3 - (int)(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    t = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
         *)operator_new(0x38);
    (t->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 0;
    p_Var1 = &(t->m)._M_t._M_impl.super__Rb_tree_header;
    (t->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (t->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (t->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (t->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (t->m)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48 = &local_50;
    local_50 = 0;
    local_38 = &local_51;
    __pred._M_pred.key = (Key *)__filename;
    __pred._M_pred.result = local_48;
    __pred._M_pred.keyCompare = local_38;
    __result.iter._M_node = &p_Var1->_M_header;
    __result.container = &t->m;
    pcStack_40 = __filename;
    std::
    __remove_copy_if<std::_Rb_tree_const_iterator<std::pair<int_const,QPointer<QAbstractItemDelegate>>>,std::insert_iterator<std::map<int,QPointer<QAbstractItemDelegate>,std::less<int>,std::allocator<std::pair<int_const,QPointer<QAbstractItemDelegate>>>>>,__gnu_cxx::__ops::_Iter_pred<QMapData<std::map<int,QPointer<QAbstractItemDelegate>,std::less<int>,std::allocator<std::pair<int_const,QPointer<QAbstractItemDelegate>>>>>::copyIfNotEquivalentTo(std::map<int,QPointer<QAbstractItemDelegate>,std::less<int>,std::allocator<std::pair<int_const,QPointer<QAbstractItemDelegate>>>>const&,int_const&)::_lambda(auto:1_const&)_1_>>
              (*(_Base_ptr *)
                ((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10),
               (_Rb_tree_const_iterator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>)
               &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header,__result,__pred);
    iVar4 = (int)local_50;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_>
    ::reset(&this->d,t);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

size_type remove(const Key &key)
    {
        if (!d)
            return 0;

        if (!d.isShared())
            return size_type(d->m.erase(key));

        MapData *newData = new MapData;
        size_type result = newData->copyIfNotEquivalentTo(d->m, key);

        d.reset(newData);

        return result;
    }